

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cond.cpp
# Opt level: O1

Vec<Hpipe::Cond::Range> * __thiscall
Hpipe::Cond::ok_ranges_opt(Vec<Hpipe::Cond::Range> *__return_storage_ptr__,Cond *this,Cond *not_in)

{
  pointer pRVar1;
  iterator __position;
  int iVar2;
  uint uVar3;
  Range *r;
  pointer pRVar4;
  ulong uVar5;
  ulong uVar6;
  Vec<Hpipe::Cond::Range> *__range2;
  int iVar7;
  int iVar8;
  uint uVar9;
  bool bVar10;
  Range local_50;
  
  (__return_storage_ptr__->super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>).
  super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>).
  super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>).
  super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (not_in == (Cond *)0x0) {
    local_50.beg = 0;
    do {
      uVar5 = (ulong)local_50.beg;
      iVar2 = local_50.beg;
      if (((this->p).super__Base_bitset<4UL>._M_w[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0) {
        local_50.end = 0xff;
        if (0xff < local_50.beg) {
          local_50.end = local_50.beg;
        }
        iVar2 = local_50.end + 1;
        do {
          uVar6 = uVar5;
          if (0xfe < (long)uVar6) goto LAB_00144701;
          uVar5 = uVar6 + 1;
        } while (((this->p).super__Base_bitset<4UL>._M_w[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0);
        local_50.end = (int)uVar6;
        iVar2 = (int)uVar5;
LAB_00144701:
        local_50.exceptions.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)0x0;
        local_50.exceptions.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             (pointer)0x0;
        local_50.exceptions.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<Hpipe::Cond::Range,std::allocator<Hpipe::Cond::Range>>::
        emplace_back<Hpipe::Cond::Range_const&>
                  ((vector<Hpipe::Cond::Range,std::allocator<Hpipe::Cond::Range>> *)
                   __return_storage_ptr__,&local_50);
        if (local_50.exceptions.super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            != (pointer)0x0) {
          operator_delete(local_50.exceptions.super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_50.exceptions.super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.exceptions.super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      local_50.beg = iVar2 + 1;
    } while (iVar2 < 0xff);
  }
  else {
    iVar2 = 0;
    do {
      uVar5 = (ulong)iVar2;
      iVar8 = iVar2;
      if ((((this->p).super__Base_bitset<4UL>._M_w[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0) &&
         (((not_in->p).super__Base_bitset<4UL>._M_w[uVar5 >> 6] & 1L << ((byte)iVar2 & 0x3f)) == 0))
      {
        local_50.beg = -1;
        uVar6 = uVar5;
        do {
          uVar6 = uVar6 - 1;
          if (uVar6 == 0xffffffffffffffff) {
            local_50.beg = 0;
            goto LAB_001445c8;
          }
          local_50.beg = local_50.beg + 1;
        } while (((not_in->p).super__Base_bitset<4UL>._M_w[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0);
        local_50.beg = iVar2 - local_50.beg;
LAB_001445c8:
        if (iVar2 < 0xff) {
          uVar5 = uVar5 + 1;
          iVar8 = 0;
          do {
            if ((((this->p).super__Base_bitset<4UL>._M_w[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) == 0) &&
               (((not_in->p).super__Base_bitset<4UL>._M_w[uVar5 >> 6] & 1L << ((byte)uVar5 & 0x3f))
                == 0)) {
              iVar2 = iVar2 - iVar8;
              goto LAB_00144610;
            }
            uVar5 = uVar5 + 1;
            iVar8 = iVar8 + -1;
          } while (uVar5 != 0x100);
          iVar8 = 0x100;
          iVar2 = 0xff;
        }
        else {
LAB_00144610:
          iVar8 = iVar2 + 1;
        }
        local_50.exceptions.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)0x0;
        local_50.exceptions.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             (pointer)0x0;
        local_50.exceptions.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_50.end = iVar2;
        std::vector<Hpipe::Cond::Range,std::allocator<Hpipe::Cond::Range>>::
        emplace_back<Hpipe::Cond::Range_const&>
                  ((vector<Hpipe::Cond::Range,std::allocator<Hpipe::Cond::Range>> *)
                   __return_storage_ptr__,&local_50);
        if (local_50.exceptions.super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            != (pointer)0x0) {
          operator_delete(local_50.exceptions.super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_50.exceptions.super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.exceptions.super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      iVar2 = iVar8 + 1;
    } while (iVar8 < 0xff);
    pRVar1 = (__return_storage_ptr__->
             super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>).
             super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pRVar4 = (__return_storage_ptr__->
                  super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>).
                  super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>.
                  _M_impl.super__Vector_impl_data._M_start; pRVar4 != pRVar1; pRVar4 = pRVar4 + 1) {
      iVar8 = pRVar4->end + 1;
      iVar2 = pRVar4->beg;
      uVar5 = (ulong)iVar2;
      if (iVar8 - iVar2 != 1) {
        iVar7 = -1;
        if (iVar8 != iVar2) {
          do {
            if ((((not_in->p).super__Base_bitset<4UL>._M_w[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) == 0)
               && (bVar10 = -1 < iVar7, iVar7 = (int)uVar5, bVar10)) goto LAB_001446ac;
            uVar5 = uVar5 + 1;
          } while ((long)pRVar4->end + 1U != uVar5);
        }
        pRVar4->beg = iVar7;
        pRVar4->end = iVar7;
      }
LAB_001446ac:
    }
  }
  pRVar4 = (__return_storage_ptr__->
           super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>).
           super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0x20 < (ulong)((long)(__return_storage_ptr__->
                           super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>).
                           super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar4)) {
    uVar5 = 1;
    do {
      uVar3 = (uint)uVar5;
      uVar9 = uVar3 - 1;
      if ((1 < (pRVar4[uVar9].end - pRVar4[uVar9].beg) + 1) &&
         (pRVar4[uVar9].end + 2 == pRVar4[uVar5].beg)) {
        local_50.beg = pRVar4[uVar9].end + 1;
        __position._M_current =
             *(pointer *)
              ((long)&pRVar4[uVar9].exceptions.super_vector<int,_std::allocator<int>_> + 8);
        if (__position._M_current ==
            *(pointer *)
             ((long)&pRVar4[uVar9].exceptions.super_vector<int,_std::allocator<int>_> + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&pRVar4[uVar9].exceptions,__position,
                     &local_50.beg);
        }
        else {
          *__position._M_current = local_50.beg;
          *(int **)((long)&pRVar4[uVar9].exceptions.super_vector<int,_std::allocator<int>_> + 8) =
               __position._M_current + 1;
        }
        pRVar4 = (__return_storage_ptr__->
                 super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>).
                 super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>._M_impl
                 .super__Vector_impl_data._M_start;
        pRVar4[uVar9].end = pRVar4[uVar5].end;
        std::vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>::_M_erase
                  (&__return_storage_ptr__->
                    super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>,
                   pRVar4 + uVar5,pRVar4 + uVar5 + 1);
        uVar3 = uVar9;
      }
      uVar5 = (ulong)(uVar3 + 1);
      pRVar4 = (__return_storage_ptr__->
               super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>).
               super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(__return_storage_ptr__->
                                   super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>
                                   ).
                                   super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar4 >> 5));
  }
  return __return_storage_ptr__;
}

Assistant:

Vec<Cond::Range> Cond::ok_ranges_opt( const Cond *not_in ) const {
    Vec<Range> ra;
    if ( not_in ) {
        for( int i = 0; i < p_size; ++i ) {
            // beginning if a Range
            if ( p[ i ] and not (*not_in)[ i ] ) {
                // leftest beg
                int beg = i++;
                while ( beg and (*not_in)[ beg - 1 ] )
                    --beg;
                // rightest end
                while ( i < p_size and ( p[ i ] or (*not_in)[ i ] ) )
                    ++i;
                // register the interval
                ra << Range( beg, i - 1 );
            }
        }

        // reduction of ranges with only 1 not not_in
        for( Range &r : ra ) {
            if ( r.size() == 1 )
                continue;
            for( int i = r.beg, p = -1; ; ++i ) {
                if ( i == r.end + 1 ) {
                    r.beg = p;
                    r.end = p;
                    break;
                }
                if ( not (*not_in)[ i ] ) {
                    if ( p >= 0 )
                        break;
                    p = i;
                }
            }
        }
    } else {
        for( int i = 0; i < p_size; ++i ) {
            // beginning if a Range
            if ( p[ i ] ) {
                int beg = i++;
                while ( i < p_size and p[ i ] )
                    ++i;
                ra << Range( beg, i - 1 );
            }
        }
    }

    // [ ... x - 1 ] | [ x + 1 ... ] if cardinal first interval > 1
    for( unsigned i = 1; i < ra.size(); ++i ) {
        if ( ra[ i - 1 ].size() >= 2 and ra[ i - 1 ].end + 2 == ra[ i ].beg ) {
            ra[ i - 1 ].exceptions << ra[ i - 1 ].end + 1;
            ra[ i - 1 ].end = ra[ i ].end;
            ra.remove( i-- );
        }
    }

    return ra;
}